

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O3

void adc_dsp(t_adc *x,t_signal **sp)

{
  long lVar1;
  t_int *ptVar2;
  int iVar3;
  t_signal *ptVar4;
  long lVar5;
  int iVar6;
  
  lVar1 = x->x_n;
  if (lVar1 != 0) {
    ptVar2 = x->x_vec;
    lVar5 = 0;
    do {
      ptVar4 = sp[lVar5];
      if (ptVar4->s_n == 0x40) {
        iVar6 = (int)ptVar2[lVar5] + -1;
        if (-1 < iVar6) {
          iVar3 = sys_get_inchannels();
          ptVar4 = sp[lVar5];
          if (iVar6 < iVar3) {
            dsp_add_copy((pd_maininstance.pd_stuff)->st_soundin + (uint)(iVar6 * 0x40),ptVar4->s_vec
                         ,0x40);
            goto LAB_0011aa14;
          }
        }
        dsp_add_zero(ptVar4->s_vec,0x40);
      }
      else {
        pd_error((void *)0x0,"adc~: bad vector size");
      }
LAB_0011aa14:
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return;
}

Assistant:

static void adc_dsp(t_adc *x, t_signal **sp)
{
    t_int i, *ip;
    t_signal **sp2;
    for (i = x->x_n, ip = x->x_vec, sp2 = sp; i--; ip++, sp2++)
    {
        int ch = (int)(*ip - 1);
        if ((*sp2)->s_n != DEFDACBLKSIZE)
            pd_error(0, "adc~: bad vector size");
        else if (ch >= 0 && ch < sys_get_inchannels())
            dsp_add_copy(STUFF->st_soundin + DEFDACBLKSIZE*ch,
                (*sp2)->s_vec, DEFDACBLKSIZE);
        else dsp_add_zero((*sp2)->s_vec, DEFDACBLKSIZE);
    }
}